

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O3

int cm_zlib_gzprintf(gzFile file,char *format,...)

{
  char in_AL;
  uint len;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  char buf [4096];
  undefined8 local_10d8;
  void **local_10d0;
  undefined1 *local_10c8;
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 local_1038;
  undefined8 local_1028;
  undefined8 local_1018;
  char local_1008 [4095];
  char local_9;
  
  local_10c8 = local_10b8;
  if (in_AL != '\0') {
    local_1088 = in_XMM0_Qa;
    local_1078 = in_XMM1_Qa;
    local_1068 = in_XMM2_Qa;
    local_1058 = in_XMM3_Qa;
    local_1048 = in_XMM4_Qa;
    local_1038 = in_XMM5_Qa;
    local_1028 = in_XMM6_Qa;
    local_1018 = in_XMM7_Qa;
  }
  local_9 = '\0';
  local_10d8 = 0x3000000010;
  local_10d0 = &va[0].overflow_arg_area;
  local_10a8 = in_RDX;
  local_10a0 = in_RCX;
  local_1098 = in_R8;
  local_1090 = in_R9;
  len = vsnprintf(local_1008,0x1000,format,&local_10d8);
  iVar1 = 0;
  if ((0xfffff000 < len - 0x1000) && (iVar1 = 0, local_9 == '\0')) {
    iVar1 = cm_zlib_gzwrite(file,local_1008,len);
  }
  return iVar1;
}

Assistant:

int ZEXPORTVA gzprintf (gzFile file, const char *format, /* args */ ...)
{
    char buf[Z_PRINTF_BUFSIZE];
    va_list va;
    int len;

    buf[sizeof(buf) - 1] = 0;
    va_start(va, format);
#ifdef NO_vsnprintf
#  ifdef HAS_vsprintf_void
    (void)vsprintf(buf, format, va);
    va_end(va);
    for (len = 0; len < sizeof(buf); len++)
        if (buf[len] == 0) break;
#  else
    len = vsprintf(buf, format, va);
    va_end(va);
#  endif
#else
#  ifdef HAS_vsnprintf_void
    (void)vsnprintf(buf, sizeof(buf), format, va);
    va_end(va);
    len = strlen(buf);
#  else
    len = vsnprintf(buf, sizeof(buf), format, va);
    va_end(va);
#  endif
#endif
    if (len <= 0 || len >= (int)sizeof(buf) || buf[sizeof(buf) - 1] != 0)
        return 0;
    return gzwrite(file, buf, (unsigned)len);
}